

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableBase.cpp
# Opt level: O0

void __thiscall adios2::core::VariableBase::SetShape(VariableBase *this,Dims *shape)

{
  DataType DVar1;
  DataType DVar2;
  size_type sVar3;
  size_type sVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  long in_RDI;
  char *in_stack_fffffffffffffbc0;
  allocator *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc00;
  int commRank;
  string *in_stack_fffffffffffffc08;
  string *in_stack_fffffffffffffc10;
  string *in_stack_fffffffffffffc18;
  string *in_stack_fffffffffffffc20;
  string local_3b8 [16];
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffc58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffc60;
  string local_398 [39];
  allocator local_371;
  string local_370 [39];
  allocator local_349;
  string local_348 [39];
  undefined1 local_321 [33];
  string local_300 [32];
  string local_2e0 [39];
  allocator local_2b9;
  string local_2b8 [39];
  allocator local_291;
  string local_290 [39];
  allocator local_269;
  string local_268 [32];
  string local_248 [32];
  string local_228 [39];
  allocator local_201;
  string local_200 [39];
  allocator local_1d9;
  string local_1d8 [39];
  undefined1 local_1b1 [33];
  string local_190 [32];
  string local_170 [39];
  undefined1 local_149 [40];
  undefined1 local_121 [40];
  undefined1 local_f9 [33];
  string local_d8 [32];
  string local_b8 [39];
  undefined1 local_91 [40];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_10;
  
  DVar1 = *(DataType *)(in_RDI + 0x28);
  local_10 = in_RSI;
  DVar2 = helper::GetDataType<std::__cxx11::string>();
  if (DVar1 == DVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"Core",&local_31);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"VariableBase",&local_69);
    in_stack_fffffffffffffc20 = (string *)local_91;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_91 + 1),"SetShape",(allocator *)in_stack_fffffffffffffc20);
    std::operator+((char *)in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
    std::operator+(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
    helper::Throw<std::invalid_argument>
              (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
               in_stack_fffffffffffffc08,(int)((ulong)in_stack_fffffffffffffc00 >> 0x20));
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::~string(local_d8);
    std::__cxx11::string::~string((string *)(local_91 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_91);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  if ((*(byte *)(in_RDI + 0x54) & 1) != 0) {
    in_stack_fffffffffffffc18 = (string *)local_f9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_f9 + 1),"Core",(allocator *)in_stack_fffffffffffffc18);
    in_stack_fffffffffffffc10 = (string *)local_121;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_121 + 1),"VariableBase",(allocator *)in_stack_fffffffffffffc10);
    in_stack_fffffffffffffc08 = (string *)local_149;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_149 + 1),"SetShape",(allocator *)in_stack_fffffffffffffc08);
    std::operator+((char *)in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
    std::operator+(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
    helper::Throw<std::invalid_argument>
              (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
               in_stack_fffffffffffffc08,(int)((ulong)in_stack_fffffffffffffc00 >> 0x20));
    std::__cxx11::string::~string(local_170);
    std::__cxx11::string::~string(local_190);
    std::__cxx11::string::~string((string *)(local_149 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_149);
    std::__cxx11::string::~string((string *)(local_121 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_121);
    std::__cxx11::string::~string((string *)(local_f9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_f9);
  }
  if ((*(byte *)(in_RDI + 0x218) & 1) != 0) {
    in_stack_fffffffffffffc00 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_1b1 + 1),"Core",(allocator *)in_stack_fffffffffffffc00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d8,"VariableBase",&local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_200,"SetShape",&local_201);
    std::operator+((char *)in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
    std::operator+(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
    helper::Throw<std::invalid_argument>
              (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
               in_stack_fffffffffffffc08,(int)((ulong)in_stack_fffffffffffffc00 >> 0x20));
    std::__cxx11::string::~string(local_228);
    std::__cxx11::string::~string(local_248);
    std::__cxx11::string::~string(local_200);
    std::allocator<char>::~allocator((allocator<char> *)&local_201);
    std::__cxx11::string::~string(local_1d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
    std::__cxx11::string::~string((string *)(local_1b1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_1b1);
  }
  if (*(int *)(in_RDI + 0x40) == 5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_268,"Core",&local_269);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_290,"VariableBase",&local_291);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2b8,"SetShape",&local_2b9);
    std::operator+((char *)in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
    std::operator+(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
    helper::Throw<std::invalid_argument>
              (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
               in_stack_fffffffffffffc08,(int)((ulong)in_stack_fffffffffffffc00 >> 0x20));
    std::__cxx11::string::~string(local_2e0);
    std::__cxx11::string::~string(local_300);
    std::__cxx11::string::~string(local_2b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
    std::__cxx11::string::~string(local_290);
    std::allocator<char>::~allocator((allocator<char> *)&local_291);
    std::__cxx11::string::~string(local_268);
    std::allocator<char>::~allocator((allocator<char> *)&local_269);
  }
  sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x58));
  sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_10);
  if (sVar3 != sVar4) {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_321;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_321 + 1),"Core",(allocator *)__lhs);
    __rhs = &local_349;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_348,"VariableBase",__rhs);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_370,"SetShape",&local_371);
    std::operator+((char *)in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
    commRank = (int)((ulong)in_stack_fffffffffffffc00 >> 0x20);
    std::operator+(__lhs,(char *)__rhs);
    helper::Throw<std::invalid_argument>
              (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
               in_stack_fffffffffffffc08,commRank);
    std::__cxx11::string::~string(local_398);
    std::__cxx11::string::~string(local_3b8);
    std::__cxx11::string::~string(local_370);
    std::allocator<char>::~allocator((allocator<char> *)&local_371);
    std::__cxx11::string::~string(local_348);
    std::allocator<char>::~allocator((allocator<char> *)&local_349);
    std::__cxx11::string::~string((string *)(local_321 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_321);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  return;
}

Assistant:

void VariableBase::SetShape(const adios2::Dims &shape)
{
    if (m_Type == helper::GetDataType<std::string>())
    {
        helper::Throw<std::invalid_argument>("Core", "VariableBase", "SetShape",
                                             "string variable " + m_Name +
                                                 " is always LocalValue, can't change "
                                                 "shape, in call to SetShape");
    }

    if (m_SingleValue)
    {
        helper::Throw<std::invalid_argument>("Core", "VariableBase", "SetShape",
                                             "selection is not valid for single value variable " +
                                                 m_Name + ", in call to SetShape");
    }

    if (m_ConstantDims)
    {
        helper::Throw<std::invalid_argument>("Core", "VariableBase", "SetShape",
                                             "selection is not valid for constant shape variable " +
                                                 m_Name + ", in call to SetShape");
    }

    if (m_ShapeID == ShapeID::LocalArray)
    {
        helper::Throw<std::invalid_argument>("Core", "VariableBase", "SetShape",
                                             "can't assign shape dimensions "
                                             "to local array variable " +
                                                 m_Name + ", in call to SetShape");
    }

    if (m_Shape.size() != shape.size())
    {
        helper::Throw<std::invalid_argument>("Core", "VariableBase", "SetShape",
                                             "can't assign change dimension count on variable " +
                                                 m_Name + ", in call to SetShape");
    }
    m_Shape = shape;
#if defined(ADIOS2_HAVE_KOKKOS) || defined(ADIOS2_HAVE_GPU_SUPPORT)
    UpdateLayout(m_Shape);
#endif
}